

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_router.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_router::
set_http_handler<(cinatra::http_method)1,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
          (coro_http_router *this,string *key,
          function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *handler)

{
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  size_type sVar1;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string method_str;
  string whole_str;
  string local_a8;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> http_handler;
  string_view method_name;
  string local_38;
  
  method_name._M_len = 3;
  method_name._M_str = "GET";
  whole_str._M_dataplus._M_p = (pointer)&whole_str.field_2;
  whole_str._M_string_length = 0;
  whole_str.field_2._M_local_buf[0] = '\0';
  this_00 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&whole_str,&method_name);
  this_01 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (this_00," ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_01,key);
  http_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  http_handler._M_invoker = (_Invoker_type)0x0;
  http_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  http_handler.super__Function_base._M_functor._8_8_ = 0;
  std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::operator=
            (&http_handler,handler);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&whole_str,':',0);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&whole_str,"{",0);
    if (sVar1 == 0xffffffffffffffff) {
      sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&whole_str,")",0);
      if (sVar1 == 0xffffffffffffffff) {
        pVar2 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_emplace_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)this,&whole_str);
        if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::__cxx11::string_const&,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
                    ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->map_handles_,pVar2.first._M_node._M_node + 1,&http_handler);
        }
        goto LAB_001b08cf;
      }
    }
    std::__cxx11::string::string((string *)&method_str,&whole_str);
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&method_str,"{}",0);
    if (sVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"{}",&local_e9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"([^/]+)",&local_ea);
      replace_all(&method_str,&local_a8,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_a8,&method_str,0x10);
    std::
    vector<std::tuple<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>,std::allocator<std::tuple<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>>>
    ::
    emplace_back<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
              ((vector<std::tuple<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>,std::allocator<std::tuple<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>>>
                *)&this->regex_handles_,
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a8,&http_handler);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a8);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&method_str,&method_name,(allocator<char> *)&local_a8);
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_78 = (_Manager_type)0x0;
    local_70 = http_handler._M_invoker;
    if (http_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_88._M_unused._M_object =
           http_handler.super__Function_base._M_functor._M_unused._M_object;
      local_88._8_8_ = http_handler.super__Function_base._M_functor._8_8_;
      local_78 = http_handler.super__Function_base._M_manager;
      http_handler.super__Function_base._M_manager = (_Manager_type)0x0;
      http_handler._M_invoker = (_Invoker_type)0x0;
    }
    radix_tree::insert((this->router_tree_).
                       super___shared_ptr<cinatra::radix_tree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &whole_str,
                       (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                        *)&local_88,&method_str);
    std::_Function_base::~_Function_base((_Function_base *)&local_88);
  }
  std::__cxx11::string::~string((string *)&method_str);
LAB_001b08cf:
  std::_Function_base::~_Function_base(&http_handler.super__Function_base);
  std::__cxx11::string::~string((string *)&whole_str);
  return;
}

Assistant:

void set_http_handler(std::string key, Func handler, Aspects&&... asps) {
    constexpr auto method_name = cinatra::method_name(method);
    std::string whole_str;
    whole_str.append(method_name).append(" ").append(key);

    // hold keys to make sure map_handles_ key is
    // std::string_view, avoid memcpy when route
    using return_type = typename util::function_traits<Func>::return_type;
    if constexpr (coro_io::is_lazy_v<return_type>) {
      std::function<async_simple::coro::Lazy<void>(coro_http_request & req,
                                                   coro_http_response & resp)>
          http_handler;
      if constexpr (sizeof...(Aspects) > 0) {
        http_handler = [this, handler = std::move(handler),
                        ... asps = std::forward<Aspects>(asps)](
                           coro_http_request& req,
                           coro_http_response& resp) mutable
            -> async_simple::coro::Lazy<void> {
          bool ok = true;
          (do_before(asps, req, resp, ok), ...);
          if (ok) {
            co_await handler(req, resp);
          }
          ok = true;
          (do_after(asps, req, resp, ok), ...);
        };
      }
      else {
        http_handler = std::move(handler);
      }

      if (whole_str.find(":") != std::string::npos) {
        std::string method_str(method_name);
        coro_router_tree_->coro_insert(whole_str, std::move(http_handler),
                                       method_str);
      }
      else {
        if (whole_str.find("{") != std::string::npos ||
            whole_str.find(")") != std::string::npos) {
          std::string pattern = whole_str;

          if (pattern.find("{}") != std::string::npos) {
            replace_all(pattern, "{}", "([^/]+)");
          }

          coro_regex_handles_.emplace_back(std::regex(pattern),
                                           std::move(http_handler));
        }
        else {
          auto [it, ok] = coro_keys_.emplace(std::move(whole_str));
          if (!ok) {
            CINATRA_LOG_WARNING << key << " has already registered.";
            return;
          }
          coro_handles_.emplace(*it, std::move(http_handler));
        }
      }
    }
    else {
      std::function<void(coro_http_request & req, coro_http_response & resp)>
          http_handler;
      if constexpr (sizeof...(Aspects) > 0) {
        http_handler = [this, handler = std::move(handler),
                        ... asps = std::forward<Aspects>(asps)](
                           coro_http_request& req,
                           coro_http_response& resp) mutable {
          bool ok = true;
          (do_before(asps, req, resp, ok), ...);
          if (ok) {
            handler(req, resp);
          }
          ok = true;
          (do_after(asps, req, resp, ok), ...);
        };
      }
      else {
        http_handler = std::move(handler);
      }

      if (whole_str.find(':') != std::string::npos) {
        std::string method_str(method_name);
        router_tree_->insert(whole_str, std::move(http_handler), method_str);
      }
      else if (whole_str.find("{") != std::string::npos ||
               whole_str.find(")") != std::string::npos) {
        std::string pattern = whole_str;

        if (pattern.find("{}") != std::string::npos) {
          replace_all(pattern, "{}", "([^/]+)");
        }

        regex_handles_.emplace_back(std::regex(pattern),
                                    std::move(http_handler));
      }
      else {
        auto [it, ok] = keys_.emplace(std::move(whole_str));
        if (!ok) {
          CINATRA_LOG_WARNING << key << " has already registered.";
          return;
        }
        map_handles_.emplace(*it, std::move(http_handler));
      }
    }
  }